

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_all_gej(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RCX;
  uchar *data;
  long lVar7;
  long lVar8;
  int iVar9;
  secp256k1_gej *psVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *hash;
  secp256k1_gej *a_00;
  secp256k1_fe *psVar12;
  size_t sVar13;
  secp256k1_fe u;
  uchar uStack_89;
  uchar auStack_88 [8];
  size_t sStack_80;
  secp256k1_ge *psStack_78;
  secp256k1_fe local_60;
  
  psVar10 = a;
  a_00 = a;
  sVar13 = len;
  if (len != 0) {
    do {
      secp256k1_gej_verify(a_00);
      hash = a_00;
      secp256k1_gej_verify(a_00);
      iVar9 = (int)psVar10;
      uVar6 = (uint)in_RCX;
      if (a_00->infinity != 0) {
        secp256k1_ge_set_all_gej_cold_1();
        uStack_89 = (uchar)uVar6;
        auStack_88[4] = '\0';
        auStack_88[5] = '\0';
        auStack_88[6] = '\0';
        auStack_88[0] = '\0';
        auStack_88[1] = '\0';
        auStack_88[2] = '\0';
        auStack_88[3] = '\0';
        sStack_80 = len;
        psStack_78 = r;
        secp256k1_sha256_write((secp256k1_sha256 *)hash,auStack_88,(ulong)(iVar9 - 1));
        if (data == (uchar *)0x0) {
          uStack_89 = '\0';
          secp256k1_sha256_write((secp256k1_sha256 *)hash,&uStack_89,1);
          return;
        }
        secp256k1_sha256_write((secp256k1_sha256 *)hash,&uStack_89,1);
        secp256k1_sha256_write((secp256k1_sha256 *)hash,data,(ulong)(uVar6 & 0xff));
        return;
      }
      sVar13 = sVar13 - 1;
      a_00 = a_00 + 1;
    } while (sVar13 != 0);
    uVar1 = (a->z).n[0];
    uVar2 = (a->z).n[1];
    uVar3 = (a->z).n[2];
    uVar4 = (a->z).n[3];
    iVar9 = (a->z).magnitude;
    iVar5 = (a->z).normalized;
    (r->x).n[4] = (a->z).n[4];
    (r->x).magnitude = iVar9;
    (r->x).normalized = iVar5;
    (r->x).n[2] = uVar3;
    (r->x).n[3] = uVar4;
    (r->x).n[0] = uVar1;
    (r->x).n[1] = uVar2;
    if (len != 1) {
      lVar8 = len - 1;
      psVar12 = &a[1].z;
      psVar11 = r;
      do {
        secp256k1_fe_mul(&psVar11[1].x,&psVar11->x,psVar12);
        psVar12 = (secp256k1_fe *)(psVar12[3].n + 1);
        lVar8 = lVar8 + -1;
        psVar11 = psVar11 + 1;
      } while (lVar8 != 0);
    }
    lVar8 = len - 1;
    secp256k1_fe_inv(&local_60,&r[lVar8].x);
    if (lVar8 != 0) {
      psVar11 = r + (len - 2);
      psVar12 = &a[len - 1].z;
      do {
        secp256k1_fe_mul(&psVar11[1].x,&psVar11->x,&local_60);
        secp256k1_fe_mul(&local_60,&local_60,psVar12);
        psVar11 = psVar11 + -1;
        psVar12 = (secp256k1_fe *)&psVar12[-4].magnitude;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    (r->x).n[4] = local_60.n[4];
    (r->x).magnitude = local_60.magnitude;
    (r->x).normalized = local_60.normalized;
    (r->x).n[2] = local_60.n[2];
    (r->x).n[3] = local_60.n[3];
    (r->x).n[0] = local_60.n[0];
    (r->x).n[1] = local_60.n[1];
    lVar7 = len + (len == 0);
    psVar11 = r;
    lVar8 = lVar7;
    do {
      secp256k1_ge_set_gej_zinv(psVar11,a,&psVar11->x);
      a = a + 1;
      psVar11 = psVar11 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    do {
      secp256k1_ge_verify(r);
      r = r + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
        VERIFY_CHECK(!secp256k1_gej_is_infinity(&a[i]));
    }
#endif

    if (len == 0) {
        return;
    }

    /* Use destination's x coordinates as scratch space */
    r[0].x = a[0].z;
    for (i = 1; i < len; i++) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &a[i].z);
    }
    secp256k1_fe_inv(&u, &r[len - 1].x);

    for (i = len - 1; i > 0; i--) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &u);
        secp256k1_fe_mul(&u, &u, &a[i].z);
    }
    r[0].x = u;

    for (i = 0; i < len; i++) {
        secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}